

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
FeatureResolverPoolTest_CompileDefaultsInvalidDefaultsBeforeIntroduced_Test::
~FeatureResolverPoolTest_CompileDefaultsInvalidDefaultsBeforeIntroduced_Test
          (FeatureResolverPoolTest_CompileDefaultsInvalidDefaultsBeforeIntroduced_Test *this)

{
  FeatureResolverPoolTest::~FeatureResolverPoolTest(&this->super_FeatureResolverPoolTest);
  operator_delete(this,0x1c0);
  return;
}

Assistant:

TEST_F(FeatureResolverPoolTest,
       CompileDefaultsInvalidDefaultsBeforeIntroduced) {
  const FileDescriptor* file = ParseSchema(R"schema(
    syntax = "proto2";
    package test;
    import "google/protobuf/descriptor.proto";

    extend google.protobuf.FeatureSet {
      optional Foo bar = 9999;
    }
    message Foo {
      optional bool bool_field = 1 [
        targets = TARGET_TYPE_FIELD,
        feature_support = {
          edition_introduced: EDITION_2024
        },
        edition_defaults = { edition: EDITION_LEGACY, value: "true" },
        edition_defaults = { edition: EDITION_2023, value: "false" }
      ];
    }
  )schema");
  ASSERT_NE(file, nullptr);

  const FieldDescriptor* ext = file->extension(0);
  EXPECT_THAT(FeatureResolver::CompileDefaults(feature_set_, {ext},
                                               EDITION_2023, EDITION_2023),
              HasError(AllOf(HasSubstr("test.Foo.bool_field"),
                             HasSubstr("specified for edition 2023"),
                             HasSubstr("before it was introduced"))));
}